

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

bool __thiscall CppJieba::Trie::dispose(Trie *this)

{
  bool bVar1;
  char *pcVar2;
  Trie *in_RDI;
  bool ret;
  char *local_60;
  TrieNode *in_stack_ffffffffffffffb8;
  Trie *in_stack_ffffffffffffffc0;
  string local_38 [39];
  byte local_11;
  bool local_1;
  
  bVar1 = _getInitFlag(in_RDI);
  if (bVar1) {
    local_11 = _deleteNode(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if ((bool)local_11) {
      in_RDI->_root = (TrieNode *)0x0;
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::clear
                ((vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *)0x1381b7
                );
      _setInitFlag(in_RDI,false);
      local_1 = (bool)(local_11 & 1);
    }
    else {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        local_60 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp";
      }
      else {
        local_60 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                           ,0x2f);
        local_60 = local_60 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_38,"_deleteNode failed!",(allocator *)&stack0xffffffffffffffc7);
      Limonp::Logger::LoggingF(4,local_60,0x75,(string *)local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool dispose()
            {
                if(!_getInitFlag())
                {
                    return false;
                }
                bool ret = _deleteNode(_root);
                if(!ret)
                {
                    LogFatal("_deleteNode failed!");
                    return false;
                }
                _root = NULL;
                _nodeInfoVec.clear();

                _setInitFlag(false);
                return ret;
            }